

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O1

void __thiscall
CGameClient::DoTeamChangeMessage(CGameClient *this,char *pName,int ClientID,int Team)

{
  ulong uVar1;
  char *format;
  long in_FS_OFFSET;
  char aLabel [64];
  char aBuf [128];
  char acStack_e8 [64];
  char local_a8 [136];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetPlayerLabel(this,acStack_e8,0x40,ClientID,pName);
  if (((this->m_GameInfo).m_GameFlags & 1) == 0) {
    uVar1 = (ulong)(Team != 0) * 3;
  }
  else {
    uVar1 = 1;
    if (Team != 0) {
      uVar1 = (ulong)(Team == 1) ^ 3;
    }
  }
  format = Localize(&DAT_001df074 + *(int *)(&DAT_001df074 + uVar1 * 4),"");
  str_format(local_a8,0x80,format);
  CChat::AddLine(this->m_pChat,local_a8,-1,0,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::DoTeamChangeMessage(const char *pName, int ClientID, int Team)
{
	char aBuf[128];
	char aLabel[64];
	GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, pName);
	switch(GetStrTeam(Team, m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS))
	{
	case STR_TEAM_GAME: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the game"), aLabel); break;
	case STR_TEAM_RED: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the red team"), aLabel); break;
	case STR_TEAM_BLUE: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the blue team"), aLabel); break;
	case STR_TEAM_SPECTATORS: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the spectators"), aLabel); break;
	}
	m_pChat->AddLine(aBuf);
}